

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v8::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  fp x;
  float_specs specs_00;
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  buffer<char> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  int in_EDI;
  decimal_fp<double> dVar6;
  fp fVar7;
  fp value_00;
  longdouble in_stack_00000008;
  size_t num_digits;
  fixed_handler handler;
  int max_double_digits;
  fp cached_pow;
  fp normalized;
  int cached_exp10;
  int min_exp;
  int exp;
  int *in_stack_00000148;
  buffer<char> *in_stack_00000150;
  decimal_fp<double> dec;
  decimal_fp<float> dec_1;
  bool fixed;
  char digit_1;
  uint64_t remainder;
  anon_class_16_2_fdf32556 divmod_integral;
  uint32_t digit;
  result result;
  uint64_t fractional;
  uint32_t integral;
  fp one;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 uVar9;
  undefined2 in_stack_fffffffffffffdd0;
  undefined2 uVar10;
  undefined6 in_stack_fffffffffffffdd2;
  undefined2 in_stack_fffffffffffffdd8;
  undefined2 in_stack_fffffffffffffdda;
  int in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  uint in_stack_fffffffffffffde4;
  int *in_stack_fffffffffffffde8;
  uint64_t in_stack_fffffffffffffdf0;
  fixed_handler *remainder_00;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  fixed_handler *this;
  undefined8 in_stack_fffffffffffffe30;
  float x_00;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_fffffffffffffe38;
  unsigned_long in_stack_fffffffffffffe40;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_fffffffffffffe48;
  double in_stack_fffffffffffffe78;
  buffer<char> *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffebc;
  undefined8 in_stack_fffffffffffffec0;
  undefined2 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uStack_11c;
  uint local_118;
  int local_f4 [5];
  significand_type local_e0;
  int local_d8;
  decimal_fp<float> local_bc;
  undefined8 local_b4;
  undefined1 local_ac;
  undefined1 local_ab;
  byte local_aa;
  bool local_a9;
  buffer<char> *local_a8;
  int local_9c;
  longdouble local_98;
  undefined8 local_88;
  int local_80;
  char local_79;
  long local_78;
  bool local_69;
  anon_class_16_2_fdf32556 local_68;
  uint32_t local_58;
  result local_54;
  ulong local_50;
  bool local_46;
  bool local_45;
  uint32_t local_44;
  fp local_40;
  fixed_handler *local_30;
  int *local_28;
  long local_20;
  ulong local_18;
  int local_10;
  result local_4;
  
  x_00 = (float)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  local_98 = in_stack_00000008;
  local_a9 = (longdouble)0 <= in_stack_00000008;
  local_a8 = in_RDX;
  local_9c = in_EDI;
  local_88 = in_RSI;
  ignore_unused<bool,char[18]>(&local_a9,(char (*) [18])"value is negative");
  local_aa = local_88._4_1_ == '\x02';
  if ((longdouble)0 < local_98) {
    if ((local_88._4_4_ >> 0x13 & 1) == 0) {
      local_b4 = local_88;
      specs_00._4_4_ = in_stack_fffffffffffffee0;
      specs_00.precision = in_stack_fffffffffffffedc;
      local_80 = snprintf_float<long_double>
                           ((longdouble)
                            CONCAT28(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc,specs_00,in_stack_fffffffffffffeb0);
    }
    else if (local_9c < 0) {
      if ((local_88._4_4_ >> 0x12 & 1) == 0) {
        dVar6 = dragonbox::to_decimal<double>(in_stack_fffffffffffffe78);
        local_e0 = dVar6.significand;
        local_d8 = dVar6.exponent;
        appender::back_insert_iterator
                  ((appender *)CONCAT62(in_stack_fffffffffffffdd2,in_stack_fffffffffffffdd0),
                   (buffer<char> *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        write<char,_fmt::v8::appender,_unsigned_long,_0>
                  ((appender)in_stack_fffffffffffffe48.container,in_stack_fffffffffffffe40);
        local_80 = local_d8;
      }
      else {
        local_bc = dragonbox::to_decimal<float>(x_00);
        appender::back_insert_iterator
                  ((appender *)CONCAT62(in_stack_fffffffffffffdd2,in_stack_fffffffffffffdd0),
                   (buffer<char> *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        write<char,_fmt::v8::appender,_unsigned_int,_0>
                  ((appender)in_stack_fffffffffffffe38.container,(uint)x_00);
        local_80 = local_bc.exponent;
      }
    }
    else {
      local_f4[0] = 0;
      uVar8 = SUB104(local_98,0);
      uVar9 = (undefined4)((unkuint10)local_98 >> 0x20);
      uVar10 = (undefined2)((unkuint10)local_98 >> 0x40);
      fp::fp<long_double>((fp *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                          (longdouble)
                          CONCAT28(in_stack_fffffffffffffdd8,
                                   CONCAT62(in_stack_fffffffffffffdd2,uVar10)));
      value_00.f = (ulong)local_118;
      value_00._8_8_ = extraout_RDX;
      normalize<0>((detail *)CONCAT44(uStack_11c,in_stack_fffffffffffffee0),value_00);
      get_cached_power((int)(in_stack_fffffffffffffdf0 >> 0x20),in_stack_fffffffffffffde8);
      x.f._2_2_ = in_stack_fffffffffffffdda;
      x.f._0_2_ = in_stack_fffffffffffffdd8;
      x.f._4_4_ = in_stack_fffffffffffffddc;
      x.e = in_stack_fffffffffffffde0;
      x._12_4_ = in_stack_fffffffffffffde4;
      fVar7.f._4_4_ = uVar9;
      fVar7.f._0_4_ = uVar8;
      fVar7.e._0_2_ = uVar10;
      fVar7._10_6_ = in_stack_fffffffffffffdd2;
      fVar7 = operator*(x,fVar7);
      local_18 = fVar7.f;
      local_10 = fVar7.e;
      if (0x2ff < local_9c) {
        local_9c = 0x2ff;
      }
      buffer<char>::data(local_a8);
      local_20 = 1;
      local_28 = local_f4;
      local_30 = (fixed_handler *)&stack0xfffffffffffffe48;
      fp::fp(&local_40,1L << (-(char)fVar7.e & 0x3fU),local_10);
      local_44 = (uint32_t)(local_18 >> (-(char)local_40.e & 0x3fU));
      local_45 = local_44 != 0;
      ignore_unused<bool,char[1]>(&local_45,(char (*) [1])0x1c6bb0);
      local_46 = (ulong)local_44 == local_18 >> (-(char)local_40.e & 0x3fU);
      ignore_unused<bool,char[1]>(&local_46,(char (*) [1])0x1c6bb0);
      local_50 = local_18 & local_40.f - 1;
      iVar2 = count_digits(local_44);
      *local_28 = iVar2;
      this = local_30;
      power_of_10_64(*local_28 + -1);
      local_4 = fixed_handler::on_start
                          ((fixed_handler *)
                           CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                           in_stack_fffffffffffffdf0,(uint64_t)in_stack_fffffffffffffde8,
                           CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                           (int *)CONCAT44(in_stack_fffffffffffffddc,
                                           CONCAT22(in_stack_fffffffffffffdda,
                                                    in_stack_fffffffffffffdd8)));
      if (local_4 == more) {
        do {
          local_54 = 0;
          local_58 = 0;
          local_68.digit = &local_58;
          local_68.integral = &local_44;
          uVar5 = (ulong)(*local_28 - 1);
          switch(uVar5) {
          case 0:
            local_58 = local_44;
            local_44 = 0;
            break;
          case 1:
            grisu_gen_digits<fmt::v8::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,10);
            break;
          case 2:
            grisu_gen_digits<fmt::v8::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,100);
            break;
          case 3:
            grisu_gen_digits<fmt::v8::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,1000);
            break;
          case 4:
            grisu_gen_digits<fmt::v8::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,10000);
            break;
          case 5:
            grisu_gen_digits<fmt::v8::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,100000);
            break;
          case 6:
            grisu_gen_digits<fmt::v8::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,1000000);
            break;
          case 7:
            grisu_gen_digits<fmt::v8::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,10000000);
            break;
          case 8:
            grisu_gen_digits<fmt::v8::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,100000000);
            break;
          case 9:
            grisu_gen_digits<fmt::v8::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,1000000000);
            break;
          default:
            local_69 = false;
            ignore_unused<bool,char[25]>(&local_69,(char (*) [25])"invalid number of digits");
          }
          *local_28 = *local_28 + -1;
          local_78 = ((ulong)local_44 << (-(char)local_40.e & 0x3fU)) + local_50;
          cVar1 = (char)local_58 + '0';
          remainder_00 = local_30;
          power_of_10_64(*local_28);
          local_4 = fixed_handler::on_digit
                              (this,(char)(uVar5 >> 0x38),CONCAT17(cVar1,in_stack_fffffffffffffdf8),
                               (uint64_t)remainder_00,(uint64_t)in_stack_fffffffffffffde8,
                               in_stack_fffffffffffffde4,
                               SUB41((uint)in_stack_fffffffffffffde0 >> 0x18,0));
          if (local_4 != more) goto LAB_001b918c;
        } while (0 < *local_28);
        do {
          local_54 = 0;
          local_20 = local_20 * 10;
          local_79 = (char)(local_50 * 10 >> (-(char)local_40.e & 0x3fU)) + '0';
          local_50 = local_40.f - 1 & local_50 * 10;
          *local_28 = *local_28 + -1;
          local_4 = fixed_handler::on_digit
                              (this,(char)(uVar5 >> 0x38),CONCAT17(cVar1,in_stack_fffffffffffffdf8),
                               (uint64_t)remainder_00,(uint64_t)in_stack_fffffffffffffde8,
                               in_stack_fffffffffffffde4,
                               SUB41((uint)in_stack_fffffffffffffde0 >> 0x18,0));
        } while (local_4 == more);
      }
LAB_001b918c:
      local_54 = local_4;
      if (local_4 == error) {
        local_f4[0] = local_f4[0] + -1;
        fallback_format<long_double>
                  (stack0x00000160,dec.significand._4_4_,dec.significand._3_1_,in_stack_00000150,
                   in_stack_00000148);
      }
      else {
        to_unsigned<int>(0);
        buffer<char>::try_resize
                  ((buffer<char> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   CONCAT44(in_stack_fffffffffffffddc,
                            CONCAT22(in_stack_fffffffffffffdda,in_stack_fffffffffffffdd8)));
      }
      if (((local_aa & 1) == 0) && ((local_88._4_4_ >> 0x14 & 1) == 0)) {
        sVar3 = buffer<char>::size(local_a8);
        while( true ) {
          in_stack_fffffffffffffde4 = in_stack_fffffffffffffde4 & 0xffffff;
          if (sVar3 != 0) {
            pcVar4 = buffer<char>::operator[]<unsigned_long>(local_a8,sVar3 - 1);
            in_stack_fffffffffffffde4 = CONCAT13(*pcVar4 == '0',(int3)in_stack_fffffffffffffde4);
          }
          if ((char)(in_stack_fffffffffffffde4 >> 0x18) == '\0') break;
          sVar3 = sVar3 - 1;
          local_f4[0] = local_f4[0] + 1;
        }
        buffer<char>::try_resize
                  ((buffer<char> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   CONCAT44(in_stack_fffffffffffffddc,
                            CONCAT22(in_stack_fffffffffffffdda,in_stack_fffffffffffffdd8)));
      }
      local_80 = local_f4[0];
    }
  }
  else if ((local_9c < 1) || (!(bool)local_aa)) {
    local_ab = 0x30;
    buffer<char>::push_back
              ((buffer<char> *)CONCAT62(in_stack_fffffffffffffdd2,in_stack_fffffffffffffdd0),
               (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_80 = 0;
  }
  else {
    to_unsigned<int>(0);
    buffer<char>::try_resize
              ((buffer<char> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               CONCAT44(in_stack_fffffffffffffddc,
                        CONCAT22(in_stack_fffffffffffffdda,in_stack_fffffffffffffdd8)));
    buffer<char>::data(local_a8);
    local_ac = 0x30;
    std::uninitialized_fill_n<char*,int,char>
              ((char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffddc,
               (char *)CONCAT62(in_stack_fffffffffffffdd2,in_stack_fffffffffffffdd0));
    local_80 = -local_9c;
  }
  return local_80;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}